

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

optional<helics::ActionMessage> * __thiscall
helics::FederateState::processPostTerminationAction
          (optional<helics::ActionMessage> *__return_storage_ptr__,FederateState *this,
          ActionMessage *action)

{
  ActionMessage AStack_c8;
  
  (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
  super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
  super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
  if (action->messageAction == cmd_request_current_time) {
    ActionMessage::ActionMessage
              (&AStack_c8,cmd_disconnect,(GlobalFederateId)(this->global_id)._M_i.gid,
               (GlobalFederateId)(action->source_id).gid);
    std::optional<helics::ActionMessage>::operator=(__return_storage_ptr__,&AStack_c8);
    ActionMessage::~ActionMessage(&AStack_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<ActionMessage>
    FederateState::processPostTerminationAction(const ActionMessage& action)  // NOLINT
{
    std::optional<ActionMessage> optAct;
    switch (action.action()) {
        case CMD_REQUEST_CURRENT_TIME:
            optAct = ActionMessage(CMD_DISCONNECT, global_id.load(), action.source_id);
            break;
        default:
            break;
    }
    return optAct;
}